

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O0

void printshape(char *out_file)

{
  FILE *__stream;
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  double dVar4;
  long lVar5;
  reference pvVar6;
  int local_ac;
  undefined1 auStack_a8 [4];
  int k;
  paaword now;
  int j;
  int i;
  FILE *f;
  char *out_file_local;
  
  __stream = fopen(out_file,"w");
  for (now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < num_c;
      now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    fprintf(__stream,"%d\n",
            (ulong)(uint)shapelets_n
                         [now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_]);
    now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
    while( true ) {
      uVar1 = (ulong)(int)now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count;
      sVar2 = std::vector<paaword,_std::allocator<paaword>_>::size
                        (results + now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
                        );
      if (sVar2 <= uVar1) break;
      pvVar3 = std::vector<paaword,_std::allocator<paaword>_>::operator[]
                         (results + now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                    _4_4_,
                          (long)(int)now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count);
      paaword::paaword((paaword *)auStack_a8,pvVar3);
      dVar4 = -_auStack_a8;
      lVar5 = (long)now.score._0_4_;
      sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&now.window);
      fprintf(__stream,"%f,%d",dVar4,lVar5 * sVar2);
      local_ac = 0;
      while( true ) {
        lVar5 = (long)now.score._0_4_;
        sVar2 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&now.window);
        if (lVar5 * sVar2 <= (ulong)(long)local_ac) break;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&now.window,
                            (long)(local_ac / now.score._0_4_));
        paa2ts(*pvVar6);
        fprintf(__stream,",%f");
        local_ac = local_ac + 1;
      }
      fprintf(__stream,"\n");
      paaword::~paaword((paaword *)auStack_a8);
      now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void printshape(char *out_file) {
    FILE *f;
    f = fopen(out_file, "w");

    for (int i = 0; i < num_c; ++i) {
        fprintf(f, "%d\n", shapelets_n[i]);
//        for (paaword now : results[i]) {
        for (int j = 0; j < results[i].size(); ++j) {
            paaword now = results[i][j];
            fprintf(f, "%f,%d", -now.score, now.window * now.vec.size());
            for (int k = 0; k < now.window * now.vec.size(); ++k) {
                fprintf(f, ",%f", paa2ts(now.vec[k / now.window]));
            }
            fprintf(f, "\n");
//            fprintf(f, "vector\t\t");
//            for (int k = 0; k < now.vec.size(); ++k) {
//                fprintf(f, " %d", now.vec[k]);
//            }
//            fprintf(f, "\ncover\t\t");
//            for (set<int>::iterator cov = now.cov.begin(); cov != now.cov.end(); ++cov) {
//                fprintf(f, " %d", *cov);
//            }
//            fprintf(f, "\nall cover\t");
//            for (set<int>::iterator cov = now.allcov.begin(); cov != now.allcov.end(); ++cov) {
//                fprintf(f, " %d", *cov);
//            }
//            fprintf(f, "\n");
        }
    }

    fclose(f);
}